

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiKeyChord ImGui::FixupKeyChord(ImGuiKeyChord key_chord)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = key_chord & 0xffff0fff;
  if (uVar2 - 0x20f < 8) {
    uVar1 = 0x1000;
    if ((uVar2 != 0x20f) && (uVar2 != 0x213)) {
      uVar2 = key_chord & 0xffff0ffb;
      if (uVar2 == 0x210) {
        uVar1 = 0x2000;
      }
      else if (uVar2 == 0x211) {
        uVar1 = 0x4000;
      }
      else {
        uVar1 = (uint)(uVar2 == 0x212) << 0xf;
      }
    }
    key_chord = key_chord | uVar1;
  }
  return key_chord;
}

Assistant:

ImGuiKeyChord ImGui::FixupKeyChord(ImGuiKeyChord key_chord)
{
    // Add ImGuiMod_XXXX when a corresponding ImGuiKey_LeftXXX/ImGuiKey_RightXXX is specified.
    ImGuiKey key = (ImGuiKey)(key_chord & ~ImGuiMod_Mask_);
    if (IsModKey(key))
        key_chord |= GetModForModKey(key);
    return key_chord;
}